

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int flatcc_builder_custom_init
              (flatcc_builder_t *B,flatcc_builder_emit_fun *emit,void *emit_context,
              flatcc_builder_alloc_fun *alloc,void *alloc_context)

{
  code *pcVar1;
  
  memset(B,0,400);
  if (emit == (flatcc_builder_emit_fun *)0x0) {
    B->is_default_emitter = 1;
    emit_context = &B->default_emit_context;
    emit = flatcc_emitter;
  }
  pcVar1 = flatcc_builder_default_alloc;
  if (alloc != (flatcc_builder_alloc_fun *)0x0) {
    pcVar1 = alloc;
  }
  B->alloc_context = alloc_context;
  B->alloc = pcVar1;
  B->emit_context = emit_context;
  B->emit = emit;
  return 0;
}

Assistant:

int flatcc_builder_custom_init(flatcc_builder_t *B,
        flatcc_builder_emit_fun *emit, void *emit_context,
        flatcc_builder_alloc_fun *alloc, void *alloc_context)
{
    /*
     * Do not allocate anything here. Only the required buffers will be
     * allocated. For simple struct buffers, no allocation is required
     * at all.
     */
    memset(B, 0, sizeof(*B));

    if (emit == 0) {
        B->is_default_emitter = 1;
        emit = flatcc_emitter;
        emit_context = &B->default_emit_context;
    }
    if (alloc == 0) {
        alloc = flatcc_builder_default_alloc;
    }
    B->alloc_context = alloc_context;
    B->alloc = alloc;
    B->emit_context = emit_context;
    B->emit = emit;
    return 0;
}